

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall
r_comp::Compiler::read_number
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  uint uVar1;
  element_type *peVar2;
  bool bVar3;
  bool bVar4;
  Atom *this_00;
  uint16_t *extent_index_00;
  undefined7 in_register_00000011;
  int iVar5;
  bool bVar6;
  allocator aaStack_2b8 [7];
  allocator local_2b1;
  uint local_2b0;
  undefined4 local_2ac;
  uint16_t *local_2a8;
  double num;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_280;
  locale local_270 [8];
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_268;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_258;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_248;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_238;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_218;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_208;
  Class local_1f8;
  istringstream stream;
  uint auStack_190 [88];
  
  local_2ac = (undefined4)CONCAT71(in_register_00000011,enforce);
  local_2a8 = extent_index;
  std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_208,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
  bVar3 = read_nil_nb(this,(Ptr *)&local_208,write_index,(uint16_t *)p,write);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_208._M_refcount);
  bVar6 = true;
  if (!bVar3) {
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_218,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
              );
    bVar3 = read_forever_nb(this,(Ptr *)&local_218,write_index,(uint16_t *)p,write);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_218._M_refcount);
    if (!bVar3) {
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_268,
                 &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
      Class::Class(&local_1f8,NUMBER);
      bVar3 = read_variable(this,(Ptr *)&local_268,write_index,(uint16_t *)p,write,&local_1f8);
      Class::~Class(&local_1f8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_268._M_refcount);
      if (!bVar3) {
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_228,
                   &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
        extent_index_00 = local_2a8;
        bVar3 = read_reference(this,(Ptr *)&local_228,write_index,local_2a8,write,NUMBER);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_228._M_refcount);
        if (!bVar3) {
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_238,
                     &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
          bVar3 = read_wildcard(this,(Ptr *)&local_238,write_index,extent_index_00,write);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_238._M_refcount);
          if (!bVar3) {
            std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_248,
                       &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
            bVar3 = read_tail_wildcard(this,(Ptr *)&local_248,write_index,extent_index_00,write);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_248._M_refcount)
            ;
            if (!bVar3) {
              bVar3 = std::operator!=(&((node->
                                        super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->cmd,"");
              if (bVar3) {
                peVar2 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr;
                std::__cxx11::string::string((string *)&stream,"0x",aaStack_2b8);
                bVar3 = r_code::Utils::StartsWith(&peVar2->cmd,(string *)&stream);
                if (bVar3) {
                  std::__cxx11::string::~string((string *)&stream);
                }
                else {
                  peVar2 = (node->
                           super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr;
                  std::__cxx11::string::string((string *)&num,"us",&local_2b1);
                  bVar3 = r_code::Utils::EndsWith(&peVar2->cmd,(string *)&num);
                  std::__cxx11::string::~string((string *)&num);
                  std::__cxx11::string::~string((string *)&stream);
                  if (!bVar3) {
                    std::__cxx11::istringstream::istringstream
                              ((istringstream *)&stream,
                               (string *)
                               &((node->
                                 super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->cmd,_S_in);
                    std::locale::locale((locale *)&num,"C");
                    std::ios::imbue(local_270);
                    std::locale::~locale(local_270);
                    std::locale::~locale((locale *)&num);
                    std::istream::_M_extract<double>((double *)&stream);
                    uVar1 = *(uint *)((long)auStack_190 + *(long *)(_stream + -0x18));
                    if (write && (uVar1 & 5) == 0) {
                      r_code::Atom::Float((float)num);
                      this_00 = r_code::vector<r_code::Atom>::operator[]
                                          ((vector<r_code::Atom> *)(this->current_object + 8),
                                           (ulong)write_index);
                      r_code::Atom::operator=(this_00,(Atom *)aaStack_2b8);
                      r_code::Atom::~Atom((Atom *)aaStack_2b8);
                    }
                    std::__cxx11::istringstream::~istringstream((istringstream *)&stream);
                    if ((uVar1 & 5) == 0) {
                      return true;
                    }
                  }
                }
              }
              local_2b0 = (uint)(this->state).pattern_lvl;
              bVar3 = (this->state).no_arity_check;
              std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_280,
                         &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
              ;
              bVar4 = expression(this,(Ptr *)&local_280,NUMBER,write_index,local_2a8,write);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_280._M_refcount);
              if (!bVar4) {
                iVar5 = (uint)bVar3 * 0x10000 + local_2b0;
                (this->state).pattern_lvl = (uint16_t)iVar5;
                (this->state).no_arity_check = SUB41((uint)iVar5 >> 0x10,0);
                if ((char)local_2ac != '\0') {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&stream,
                                 " error: expected a number or an expr evaluating to a number, got: "
                                 ,&((node->
                                    super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->cmd);
                  std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                            (&local_258,
                             &node->
                              super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
                  set_error(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&stream,(Ptr *)&local_258);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&local_258._M_refcount);
                  std::__cxx11::string::~string((string *)&stream);
                }
                bVar6 = false;
              }
            }
          }
        }
      }
    }
  }
  return bVar6;
}

Assistant:

bool Compiler::read_number(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write)   // p always NULL
{
    if (read_nil_nb(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_forever_nb(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_variable(node, write_index, extent_index, write, NUMBER)) {
        return true;
    }

    if (read_reference(node, write_index, extent_index, write, NUMBER)) {
        return true;
    }

    if (read_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_tail_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (node->cmd != "" && !Utils::StartsWith(node->cmd, "0x") && !Utils::EndsWith(node->cmd, "us")) { // Make sure it isn't a hex num or a timestamp
        std::istringstream stream(node->cmd);
        stream.imbue(std::locale("C"));
        double num;
        stream >> num;
        if (!stream.fail()) {
            if (write) {
                current_object->code[write_index] = Atom::Float(num);
            }
            return true;
        }
    }

    State s = save_state();

    if (expression(node, NUMBER, write_index, extent_index, write)) {
        return true;
    }

    restore_state(s);

    if (enforce) {
        set_error(" error: expected a number or an expr evaluating to a number, got: " + node->cmd, node);
        return false;
    }

    return false;
}